

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O1

void __thiscall
Js::ParseableFunctionInfo::ForEachNestedFunc<ByteCodeGenerator::EmitOneFunction(ParseNodeFnc*)::__4>
          (ParseableFunctionInfo *this,anon_class_8_1_3e9b088b fn)

{
  LocalFunctionId functionID;
  NestedArray *pNVar1;
  FunctionProxy *this_00;
  Utf8SourceInfo *this_01;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseableFunctionInfo *pPVar5;
  ulong uVar6;
  
  pNVar1 = (this->nestedArray).ptr;
  if ((pNVar1 != (NestedArray *)0x0) && (pNVar1->nestedCount != 0)) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar6 = 0;
    do {
      this_00 = *(FunctionProxy **)((long)pNVar1[uVar6 + 1] + 8);
      if (this_00 != (FunctionProxy *)0x0) {
        if ((this_00->functionInfo).ptr == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x53e,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar3) goto LAB_00815569;
          *puVar4 = 0;
        }
        if ((((this_00->functionInfo).ptr)->functionBodyImpl).ptr != this_00) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x53f,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                      "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar3) goto LAB_00815569;
          *puVar4 = 0;
        }
        if ((((this_00->functionInfo).ptr)->attributes & DeferredParse) != None) {
          pPVar5 = FunctionProxy::GetParseableFunctionInfo(this_00);
          if (((pPVar5->super_FunctionProxy).field_0x45 & 4) != 0) {
            this_01 = ((*fn.byteCodeFunction)->super_ParseableFunctionInfo).super_FunctionProxy.
                      m_utf8SourceInfo.ptr;
            if ((this_00->functionInfo).ptr == (FunctionInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar4 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                          ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar3) {
LAB_00815569:
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *puVar4 = 0;
            }
            functionID = ((this_00->functionInfo).ptr)->functionId;
            pPVar5 = FunctionProxy::GetParseableFunctionInfo(this_00);
            Utf8SourceInfo::TrackDeferredFunction(this_01,functionID,pPVar5);
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < pNVar1->nestedCount);
  }
  return;
}

Assistant:

void ForEachNestedFunc(Fn fn)
        {
            NestedArray* nestedArray = GetNestedArray();
            if (nestedArray != nullptr)
            {
                for (uint i = 0; i < nestedArray->nestedCount; i++)
                {
                    if (!fn(nestedArray->functionInfoArray[i]->GetFunctionProxy(), i))
                    {
                        break;
                    }
                }
            }
        }